

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarmonicTorsionType.hpp
# Opt level: O1

ostream * OpenMD::operator<<(ostream *os,HarmonicTorsionType *htt)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"This HarmonicTorsionType has below form:",0x28);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(htt->d0_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"*(phi - ",8);
  poVar1 = std::ostream::_M_insert<double>(htt->phi0_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")/2",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HarmonicTorsionType& htt) {
    os << "This HarmonicTorsionType has below form:" << std::endl;
    os << htt.d0_ << "*(phi - " << htt.phi0_ << ")/2" << std::endl;
    return os;
  }